

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O3

void iDynTree::reducedModelAddAdditionalFrames
               (Model *fullModel,Model *reducedModel,string *linkInReducedModel,
               Traversal *linkSubModel,FreeFloatingPos *pos,LinkPositions *subModelBase_X_link,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
               *newLink_H_oldLink,bool includeAllAdditionalFrames,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *allowedAdditionalFrames)

{
  pointer pcVar1;
  Traversal *this;
  uint uVar2;
  JointPosDoubleArray *jointPos;
  Link *this_00;
  Link *pLVar3;
  LinkIndex frameIndex;
  Transform *pTVar4;
  pointer plVar5;
  ulong uVar6;
  string additionalFrameName_1;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  link2additionalFramesAdjacencyList;
  string additionalFrameName;
  Transform subModelBase_H_additionalFrame;
  Transform subModelBase_H_additionalFrame_1;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  Traversal *local_178;
  ulong local_170;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_168;
  string local_150 [3];
  undefined1 local_f0 [192];
  
  jointPos = FreeFloatingPos::jointPos(pos);
  computeTransformToTraversalBaseWithAdditionalTransform
            (fullModel,linkSubModel,jointPos,subModelBase_X_link,newLink_H_oldLink);
  local_168.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buildLinkToAdditionalFramesList(fullModel,&local_168);
  uVar6 = 0;
  local_178 = linkSubModel;
  while( true ) {
    this = local_178;
    uVar2 = Traversal::getNrOfVisitedLinks(local_178);
    if (uVar2 <= uVar6) break;
    this_00 = Traversal::getLink(this,uVar6);
    pLVar3 = Traversal::getParentLink(this,uVar6);
    frameIndex = Link::getIndex(this_00);
    local_170 = uVar6;
    if (pLVar3 != (Link *)0x0) {
      Model::getFrameName_abi_cxx11_(local_150,fullModel,frameIndex);
      pTVar4 = LinkPositions::operator()(subModelBase_X_link,frameIndex);
      iDynTree::Transform::Transform((Transform *)local_f0,pTVar4);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      pcVar1 = (linkInReducedModel->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,pcVar1,pcVar1 + linkInReducedModel->_M_string_length);
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,local_150[0]._M_dataplus._M_p,
                 local_150[0]._M_dataplus._M_p + local_150[0]._M_string_length);
      addAdditionalFrameIfAllowed
                (reducedModel,&local_1f8,&local_198,(Transform *)local_f0,includeAllAdditionalFrames
                 ,allowedAdditionalFrames);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150[0]._M_dataplus._M_p != &local_150[0].field_2) {
        operator_delete(local_150[0]._M_dataplus._M_p,local_150[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    plVar5 = local_168.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[frameIndex].
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (local_168.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[frameIndex].
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish !=
        plVar5) {
      uVar6 = 0;
      do {
        Model::getFrameName_abi_cxx11_(&local_1b8,fullModel,plVar5[uVar6]);
        Model::getFrameTransform((Model *)local_f0,(FrameIndex)fullModel);
        pTVar4 = LinkPositions::operator()(subModelBase_X_link,frameIndex);
        iDynTree::Transform::Transform((Transform *)local_150,pTVar4);
        iDynTree::Transform::operator*((Transform *)(local_f0 + 0x60),(Transform *)local_150);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        pcVar1 = (linkInReducedModel->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,pcVar1,pcVar1 + linkInReducedModel->_M_string_length);
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,local_1b8._M_dataplus._M_p,
                   local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
        addAdditionalFrameIfAllowed
                  (reducedModel,&local_218,&local_1d8,(Transform *)(local_f0 + 0x60),
                   includeAllAdditionalFrames,allowedAdditionalFrames);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        uVar6 = uVar6 + 1;
        plVar5 = local_168.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[frameIndex].
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
      } while (uVar6 < (ulong)((long)local_168.
                                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[frameIndex].
                                     super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)plVar5 >> 3));
    }
    uVar6 = local_170 + 1;
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&local_168);
  return;
}

Assistant:

void reducedModelAddAdditionalFrames(const Model& fullModel,
                                           Model& reducedModel,
                                     const std::string linkInReducedModel,
                                     const Traversal& linkSubModel,
                                     const FreeFloatingPos& pos,
                                           LinkPositions& subModelBase_X_link,
                                     const std::unordered_map<std::string, iDynTree::Transform>& newLink_H_oldLink,
                                     bool includeAllAdditionalFrames,
                                     const std::vector<std::string>& allowedAdditionalFrames)
{
    // First compute the transform between each link in the submodel and the submodel base
    computeTransformToTraversalBaseWithAdditionalTransform(fullModel,linkSubModel,pos.jointPos(),subModelBase_X_link,newLink_H_oldLink);

    // We then need to compute the list of additional frames for each link
    // This is a rather inefficient operation (given how frame information is stored in the Model
    // class) and is duplicated for each submodel, but this function should be called
    // just at configuration time, so this should be ok
    std::vector< std::vector<FrameIndex> > link2additionalFramesAdjacencyList;
    buildLinkToAdditionalFramesList(fullModel,link2additionalFramesAdjacencyList);

    // All the links in the traversal are lumped into the base
    // We then need to add all additional frames (and all the links
    // except for the base) to the model as additional frames of linkInReducedModel
    for(unsigned int traversalEl=0; traversalEl < linkSubModel.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = linkSubModel.getLink(traversalEl);
        LinkConstPtr parentLink  = linkSubModel.getParentLink(traversalEl);

        LinkIndex visitedLinkIndex = visitedLink->getIndex();

        // Add the link frame as an additional frame only for link that are not the submodel base
        if( parentLink != 0 )
        {
            std::string additionalFrameName = fullModel.getFrameName(visitedLinkIndex);
            Transform subModelBase_H_additionalFrame = subModelBase_X_link(visitedLinkIndex);

            addAdditionalFrameIfAllowed(reducedModel, linkInReducedModel,
                                        additionalFrameName, subModelBase_H_additionalFrame,
                                        includeAllAdditionalFrames, allowedAdditionalFrames);
        }

        // For all the link of the submodel, transfer their additional frame
        // to the lumped link in the reduced model
        for(size_t i = 0; i < link2additionalFramesAdjacencyList[visitedLinkIndex].size(); i++ )
        {
            FrameIndex additionalFrame = link2additionalFramesAdjacencyList[visitedLinkIndex][i];
            std::string additionalFrameName = fullModel.getFrameName(additionalFrame);

            Transform visitedLink_H_additionalFrame  = fullModel.getFrameTransform(additionalFrame);
            Transform subModelBase_H_visitedLink     = subModelBase_X_link(visitedLinkIndex);
            Transform subModelBase_H_additionalFrame =
                subModelBase_H_visitedLink*visitedLink_H_additionalFrame;

            addAdditionalFrameIfAllowed(reducedModel, linkInReducedModel,
                                        additionalFrameName, subModelBase_H_additionalFrame,
                                        includeAllAdditionalFrames, allowedAdditionalFrames);
        }
    }
}